

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QGraphicsProxyWidget::focusOutEvent(QGraphicsProxyWidget *this,QFocusEvent *event)

{
  long lVar1;
  FocusReason reason;
  QWidget *widget;
  
  lVar1 = *(long *)(this + 0x18);
  if (((*(long *)(lVar1 + 0x208) != 0) && (*(int *)(*(long *)(lVar1 + 0x208) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x210) != 0)) {
    widget = QWidget::focusWidget(*(QWidget **)(lVar1 + 0x210));
    if (widget != (QWidget *)0x0) {
      if ((widget->data->widget_attributes & 0x4000) != 0) {
        QGuiApplication::inputMethod();
        QInputMethod::reset();
      }
      reason = QFocusEvent::reason();
      QGraphicsProxyWidgetPrivate::removeSubFocusHelper
                ((QGraphicsProxyWidgetPrivate *)event,widget,reason);
      return;
    }
  }
  return;
}

Assistant:

T *data() const noexcept
    {
        return d;
    }